

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall Address_EmptyAddressTest_Test::TestBody(Address_EmptyAddressTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Address empty_address;
  AssertHelper local_330;
  AssertHelper local_328;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  undefined1 local_318 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308 [2];
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  void *local_2d8;
  void *local_2c0;
  void *local_2a8;
  code *local_290 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_218;
  Script local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  Address local_190 [16];
  undefined1 *local_180;
  undefined1 local_170 [16];
  void *local_160;
  void *local_148;
  void *local_130;
  code *local_118 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a0;
  Script local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  cfd::core::Address::Address(local_190);
  cfd::core::Address::GetAddress_abi_cxx11_();
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_328,"\"\"","empty_address.GetAddress().c_str()","",
             (char *)local_308[0].ptr_);
  if (local_308[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8) {
    operator_delete(local_308[0].ptr_);
  }
  if (local_328.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_320.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_308[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_308[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined1 **)local_308[0].ptr_ + 8))();
      }
      local_308[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_328.data_ = (AssertHelperData *)local_318;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
    cfd::core::Address::Address((Address *)local_308,(string *)&local_328);
    cfd::core::Address::operator=(local_190,(Address *)local_308);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c0);
    cfd::core::Script::~Script(&local_200);
    local_290[0] = cfd::core::SchnorrSignature::SchnorrSignature;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_218);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_290);
    if (local_2a8 != (void *)0x0) {
      operator_delete(local_2a8);
    }
    if (local_2c0 != (void *)0x0) {
      operator_delete(local_2c0);
    }
    if (local_2d8 != (void *)0x0) {
      operator_delete(local_2d8);
    }
    if (local_2f8[0] != local_2e8) {
      operator_delete(local_2f8[0]);
    }
    if (local_328.data_ != (AssertHelperData *)local_318) {
      operator_delete(local_328.data_);
    }
  }
  testing::Message::Message((Message *)local_308);
  testing::internal::AssertHelper::AssertHelper
            (&local_328,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
             ,0x2d,
             "Expected: (empty_address = Address(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_328,(Message *)local_308);
  testing::internal::AssertHelper::~AssertHelper(&local_328);
  if (local_308[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_308[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined1 **)local_308[0].ptr_ + 8))();
    }
    local_308[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48);
  cfd::core::Script::~Script(&local_88);
  local_118[0] = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_118);
  if (local_130 != (void *)0x0) {
    operator_delete(local_130);
  }
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (void *)0x0) {
    operator_delete(local_160);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  return;
}

Assistant:

TEST(Address, EmptyAddressTest) {
  Address empty_address;
  EXPECT_STREQ("", empty_address.GetAddress().c_str());

  EXPECT_THROW((empty_address = Address("")), CfdException);
}